

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

ParseResult * __thiscall
cmArgumentParser<void>::Parse<cmList>
          (ParseResult *__return_storage_ptr__,cmArgumentParser<void> *this,cmList *args,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unparsedArguments,size_t pos)

{
  undefined1 local_a0 [8];
  Instance instance;
  size_t pos_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unparsedArguments_local;
  cmList *args_local;
  cmArgumentParser<void> *this_local;
  ParseResult *parseResult;
  
  instance._103_1_ = 0;
  ArgumentParser::ParseResult::ParseResult(__return_storage_ptr__);
  ArgumentParser::Instance::Instance
            ((Instance *)local_a0,(ActionMap *)this,__return_storage_ptr__,unparsedArguments,
             (void *)0x0);
  ArgumentParser::Instance::Parse<cmList>((Instance *)local_a0,args,pos);
  instance._103_1_ = 1;
  ArgumentParser::Instance::~Instance((Instance *)local_a0);
  if ((instance._103_1_ & 1) == 0) {
    ArgumentParser::ParseResult::~ParseResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ParseResult Parse(Range const& args,
                    std::vector<std::string>* unparsedArguments,
                    std::size_t pos = 0) const
  {
    ParseResult parseResult;
    Instance instance(this->Bindings, &parseResult, unparsedArguments);
    instance.Parse(args, pos);
    return parseResult;
  }